

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetScrollHereY(float center_y_ratio)

{
  float fVar1;
  ImGuiWindow *window;
  float fVar2;
  float fVar3;
  
  window = GImGui->CurrentWindow;
  fVar2 = (GImGui->Style).ItemSpacing.y;
  fVar1 = (window->DC).CursorPosPrevLine.y;
  fVar3 = fVar1 - fVar2;
  SetScrollFromPosY(window,(((fVar1 + (window->DC).PrevLineSize.y + fVar2) - fVar3) * center_y_ratio
                           + fVar3) - (window->Pos).y,center_y_ratio);
  fVar2 = (window->WindowPadding).y - fVar2;
  (window->ScrollTargetEdgeSnapDist).y = (float)(~-(uint)(fVar2 <= 0.0) & (uint)fVar2);
  return;
}

Assistant:

void ImGui::SetScrollHereY(float center_y_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float spacing_y = g.Style.ItemSpacing.y;
    float target_pos_y = ImLerp(window->DC.CursorPosPrevLine.y - spacing_y, window->DC.CursorPosPrevLine.y + window->DC.PrevLineSize.y + spacing_y, center_y_ratio);
    SetScrollFromPosY(window, target_pos_y - window->Pos.y, center_y_ratio); // Convert from absolute to local pos

    // Tweak: snap on edges when aiming at an item very close to the edge
    window->ScrollTargetEdgeSnapDist.y = ImMax(0.0f, window->WindowPadding.y - spacing_y);
}